

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_mod_mpi(mbedtls_mpi *R,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_cmp_int(B,0);
  if (iVar1 < 0) {
    return -10;
  }
  iVar1 = mbedtls_mpi_div_mpi((mbedtls_mpi *)0x0,R,A,B);
  while( true ) {
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_cmp_int(R,0);
    if (-1 < iVar1) break;
    iVar1 = mbedtls_mpi_add_mpi(R,R,B);
  }
  do {
    iVar1 = mbedtls_mpi_cmp_mpi(R,B);
    if (iVar1 < 0) {
      return 0;
    }
    iVar1 = mbedtls_mpi_sub_mpi(R,R,B);
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

int mbedtls_mpi_mod_mpi( mbedtls_mpi *R, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    MPI_VALIDATE_RET( R != NULL );
    MPI_VALIDATE_RET( A != NULL );
    MPI_VALIDATE_RET( B != NULL );

    if( mbedtls_mpi_cmp_int( B, 0 ) < 0 )
        return( MBEDTLS_ERR_MPI_NEGATIVE_VALUE );

    MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( NULL, R, A, B ) );

    while( mbedtls_mpi_cmp_int( R, 0 ) < 0 )
      MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( R, R, B ) );

    while( mbedtls_mpi_cmp_mpi( R, B ) >= 0 )
      MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( R, R, B ) );

cleanup:

    return( ret );
}